

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_segment.hpp
# Opt level: O0

bool __thiscall
ELFIO::segment_impl<ELFIO::Elf32_Phdr>::load
          (segment_impl<ELFIO::Elf32_Phdr> *this,istream *stream,streampos header_offset,
          bool is_lazy_)

{
  istream *piVar1;
  bool bVar2;
  size_t value;
  unsigned_long value_00;
  streampos sVar3;
  streamoff local_58;
  __mbstate_t local_50;
  undefined1 local_48 [16];
  undefined1 local_31;
  istream *piStack_30;
  bool is_lazy__local;
  istream *stream_local;
  segment_impl<ELFIO::Elf32_Phdr> *this_local;
  streampos header_offset_local;
  
  header_offset_local._M_off = (streamoff)header_offset._M_state;
  this_local = (segment_impl<ELFIO::Elf32_Phdr> *)header_offset._M_off;
  this->pstream = stream;
  this->is_lazy = is_lazy_;
  local_31 = is_lazy_;
  piStack_30 = stream;
  stream_local = (istream *)this;
  bVar2 = address_translator::empty(this->translator);
  if (bVar2) {
    std::istream::seekg((long)piStack_30,_S_beg);
    local_48 = std::istream::tellg();
    value = std::fpos::operator_cast_to_long((fpos *)local_48);
    set_stream_size(this,value);
  }
  else {
    value_00 = std::numeric_limits<unsigned_long>::max();
    set_stream_size(this,value_00);
  }
  piVar1 = piStack_30;
  sVar3._M_state.__count = (undefined4)header_offset_local._M_off;
  sVar3._M_state.__value = (anon_union_4_2_91654ee9_for___value)header_offset_local._M_off._4_4_;
  sVar3._M_off = (streamoff)this_local;
  sVar3 = address_translator::operator[](this->translator,sVar3);
  local_58 = sVar3._M_off;
  local_50 = sVar3._M_state;
  std::istream::seekg(piVar1,local_58,local_50);
  std::istream::read((char *)piStack_30,(long)&this->ph);
  this->is_offset_set = true;
  if (((this->is_lazy & 1U) == 0) && ((this->is_loaded & 1U) == 0)) {
    header_offset_local._M_state.__value.__wchb[3] = load_data(this);
  }
  else {
    header_offset_local._M_state.__value.__wchb[3] = '\x01';
  }
  return (bool)header_offset_local._M_state.__value.__wchb[3];
}

Assistant:

bool load( std::istream&  stream,
               std::streampos header_offset,
               bool           is_lazy_ ) override
    {
        pstream = &stream;
        is_lazy = is_lazy_;

        if ( translator->empty() ) {
            stream.seekg( 0, std::istream::end );
            set_stream_size( size_t( stream.tellg() ) );
        }
        else {
            set_stream_size( std::numeric_limits<size_t>::max() );
        }

        stream.seekg( ( *translator )[header_offset] );
        stream.read( reinterpret_cast<char*>( &ph ), sizeof( ph ) );

        is_offset_set = true;

        if ( !( is_lazy || is_loaded ) ) {
            return load_data();
        }

        return true;
    }